

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildNode.cpp
# Opt level: O0

bool __thiscall
llbuild::buildsystem::BuildNode::configureAttribute
          (BuildNode *this,ConfigureContext *ctx,StringRef name,StringRef value)

{
  StringRef value_00;
  ConfigureContext *pCVar1;
  size_t sVar2;
  bool bVar3;
  bool local_1129;
  Twine local_1110;
  Twine local_10f8;
  Twine local_10e0;
  BuildNode *local_10c8;
  char *local_10c0;
  StringList local_10b8;
  char *local_10a8 [2];
  void *local_1098;
  size_t local_1090;
  Twine local_1088;
  Twine local_1070;
  Twine local_1058;
  Twine local_1040;
  Twine local_1028;
  Twine local_1010;
  Twine local_ff8;
  char *local_fe0 [2];
  BuildNode *local_fd0;
  char *local_fc8;
  char *local_fc0 [2];
  BuildNode *local_fb0;
  char *local_fa8;
  char *local_fa0 [2];
  void *local_f90;
  size_t local_f88;
  Twine local_f80;
  Twine local_f68;
  Twine local_f50;
  Twine local_f38;
  Twine local_f20;
  Twine local_f08;
  Twine local_ef0;
  char *local_ed8 [2];
  BuildNode *local_ec8;
  char *local_ec0;
  char *local_eb8 [2];
  BuildNode *local_ea8;
  char *local_ea0;
  char *local_e98 [2];
  void *local_e88;
  size_t local_e80;
  Twine local_e78;
  Twine local_e60;
  Twine local_e48;
  Twine local_e30;
  Twine local_e18;
  Twine local_e00;
  Twine local_de8;
  char *local_dd0 [2];
  BuildNode *local_dc0;
  char *local_db8;
  char *local_db0 [2];
  BuildNode *local_da0;
  char *local_d98;
  char *local_d90 [2];
  void *local_d80;
  size_t local_d78;
  Twine local_d70;
  Twine local_d58;
  Twine local_d40;
  Twine local_d28;
  Twine local_d10;
  Twine local_cf8;
  Twine local_ce0;
  char *local_cc8 [2];
  BuildNode *local_cb8;
  char *local_cb0;
  char *local_ca8 [2];
  BuildNode *local_c98;
  char *local_c90;
  char *local_c88 [2];
  void *local_c78;
  size_t local_c70;
  Twine local_c68;
  Twine local_c50;
  Twine local_c38;
  Twine local_c20;
  Twine local_c08;
  Twine local_bf0;
  Twine local_bd8;
  char *local_bc0 [2];
  BuildNode *local_bb0;
  char *local_ba8;
  char *local_ba0 [2];
  BuildNode *local_b90;
  char *local_b88;
  char *local_b80 [2];
  void *local_b70;
  size_t local_b68;
  Twine local_b60;
  Twine local_b48;
  Twine local_b30;
  Twine local_b18;
  Twine local_b00;
  Twine local_ae8;
  Twine local_ad0;
  char *local_ab8 [2];
  BuildNode *local_aa8;
  char *local_aa0;
  char *local_a98 [2];
  BuildNode *local_a88;
  char *local_a80;
  char *local_a78 [2];
  BuildNode *local_a68;
  char *local_a60;
  char *local_a58 [2];
  BuildNode *local_a48;
  char *local_a40;
  char *local_a38 [2];
  char *local_a28;
  size_t local_a20;
  ConfigureContext *local_a18;
  ConfigureContext *ctx_local;
  BuildNode *this_local;
  StringRef value_local;
  StringRef name_local;
  void *local_9c0;
  size_t local_9b8;
  char *local_9b0;
  char *local_9a8;
  char *local_9a0;
  char *local_998;
  BuildNode *local_990;
  char *local_988;
  char *local_980;
  char *local_978;
  char *local_970;
  char *local_968;
  BuildNode *local_960;
  char *local_958;
  char *local_950;
  size_t local_948;
  char *local_940;
  size_t local_938;
  void *local_930;
  size_t local_928;
  char *local_920;
  char *local_918;
  char *local_910;
  char *local_908;
  BuildNode *local_900;
  char *local_8f8;
  char *local_8f0;
  char *local_8e8;
  char *local_8e0;
  char *local_8d8;
  BuildNode *local_8d0;
  char *local_8c8;
  char *local_8c0;
  size_t local_8b8;
  char *local_8b0;
  size_t local_8a8;
  void *local_8a0;
  size_t local_898;
  char *local_890;
  char *local_888;
  char *local_880;
  char *local_878;
  BuildNode *local_870;
  char *local_868;
  char *local_860;
  char *local_858;
  char *local_850;
  char *local_848;
  BuildNode *local_840;
  char *local_838;
  char *local_830;
  size_t local_828;
  char *local_820;
  size_t local_818;
  void *local_810;
  size_t local_808;
  char *local_800;
  char *local_7f8;
  char *local_7f0;
  char *local_7e8;
  BuildNode *local_7e0;
  char *local_7d8;
  char *local_7d0;
  char *local_7c8;
  char *local_7c0;
  char *local_7b8;
  BuildNode *local_7b0;
  char *local_7a8;
  char *local_7a0;
  size_t local_798;
  char *local_790;
  size_t local_788;
  void *local_780;
  size_t local_778;
  char *local_770;
  char *local_768;
  char *local_760;
  char *local_758;
  BuildNode *local_750;
  char *local_748;
  char *local_740;
  char *local_738;
  char *local_730;
  char *local_728;
  BuildNode *local_720;
  char *local_718;
  char *local_710;
  size_t local_708;
  char *local_700;
  size_t local_6f8;
  void *local_6f0;
  size_t local_6e8;
  char *local_6e0;
  char *local_6d8;
  char *local_6d0;
  char *local_6c8;
  BuildNode *local_6c0;
  char *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  BuildNode *local_690;
  char *local_688;
  char *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  BuildNode *local_660;
  char *local_658;
  char *local_650;
  char *local_648;
  char *local_640;
  char *local_638;
  BuildNode *local_630;
  char *local_628;
  char *local_620;
  size_t local_618;
  char *local_610;
  size_t local_608;
  char *local_600;
  size_t local_5f8;
  char *local_5f0;
  char **local_5e8;
  char *local_5e0;
  char **local_5d8;
  char *local_5d0;
  char **local_5c8;
  char *local_5c0;
  char **local_5b8;
  char *local_5b0;
  char **local_5a8;
  char *local_5a0;
  char **local_598;
  char *local_590;
  char **local_588;
  char *local_580;
  char **local_578;
  char *local_570;
  char **local_568;
  char *local_560;
  char **local_558;
  char *local_550;
  char **local_548;
  char *local_540;
  char **local_538;
  char *local_530;
  char **local_528;
  char *local_520;
  char **local_518;
  char *local_510;
  char **local_508;
  char *local_500;
  char **local_4f8;
  char *local_4f0;
  char **local_4e8;
  char *local_4e0;
  char **local_4d8;
  char *local_4d0;
  char **local_4c8;
  char *local_4c0;
  char **local_4b8;
  char *local_4b0;
  char **local_4a8;
  char **local_4a0;
  char *local_498;
  size_t local_490;
  BuildNode **local_488;
  char *local_480;
  char *local_478;
  BuildNode **local_470;
  char *local_468;
  char *local_460;
  BuildNode **local_458;
  char *local_450;
  char *local_448;
  BuildNode **local_440;
  char *local_438;
  char *local_430;
  void **local_428;
  char *local_420;
  size_t local_418;
  BuildNode **local_410;
  char *local_408;
  char *local_400;
  BuildNode **local_3f8;
  char *local_3f0;
  char *local_3e8;
  void **local_3e0;
  char *local_3d8;
  size_t local_3d0;
  BuildNode **local_3c8;
  char *local_3c0;
  char *local_3b8;
  BuildNode **local_3b0;
  char *local_3a8;
  char *local_3a0;
  void **local_398;
  char *local_390;
  size_t local_388;
  BuildNode **local_380;
  char *local_378;
  char *local_370;
  BuildNode **local_368;
  char *local_360;
  char *local_358;
  void **local_350;
  char *local_348;
  size_t local_340;
  BuildNode **local_338;
  char *local_330;
  char *local_328;
  BuildNode **local_320;
  char *local_318;
  char *local_310;
  void **local_308;
  char *local_300;
  size_t local_2f8;
  BuildNode **local_2f0;
  char *local_2e8;
  char *local_2e0;
  BuildNode **local_2d8;
  char *local_2d0;
  char *local_2c8;
  void **local_2c0;
  char *local_2b8;
  size_t local_2b0;
  size_t local_2a8;
  char *local_2a0;
  void *local_298;
  int local_28c;
  char *local_288;
  char *local_280;
  BuildNode *local_278;
  int local_26c;
  char *local_268;
  char *local_260;
  BuildNode *local_258;
  int local_24c;
  size_t local_248;
  char *local_240;
  void *local_238;
  int local_22c;
  char *local_228;
  char *local_220;
  BuildNode *local_218;
  int local_20c;
  char *local_208;
  char *local_200;
  BuildNode *local_1f8;
  int local_1ec;
  size_t local_1e8;
  char *local_1e0;
  void *local_1d8;
  int local_1cc;
  char *local_1c8;
  char *local_1c0;
  BuildNode *local_1b8;
  int local_1ac;
  char *local_1a8;
  char *local_1a0;
  BuildNode *local_198;
  int local_18c;
  size_t local_188;
  char *local_180;
  void *local_178;
  int local_16c;
  char *local_168;
  char *local_160;
  BuildNode *local_158;
  int local_14c;
  char *local_148;
  char *local_140;
  BuildNode *local_138;
  int local_12c;
  size_t local_128;
  char *local_120;
  void *local_118;
  int local_10c;
  char *local_108;
  char *local_100;
  BuildNode *local_f8;
  int local_ec;
  char *local_e8;
  char *local_e0;
  BuildNode *local_d8;
  int local_cc;
  size_t local_c8;
  char *local_c0;
  void *local_b8;
  int local_ac;
  char *local_a8;
  char *local_a0;
  BuildNode *local_98;
  int local_8c;
  char *local_88;
  char *local_80;
  BuildNode *local_78;
  int local_6c;
  char *local_68;
  char *local_60;
  BuildNode *local_58;
  int local_4c;
  char *local_48;
  char *local_40;
  BuildNode *local_38;
  int local_2c;
  size_t local_28;
  char *local_20;
  char *local_18;
  int local_c;
  
  value_local.Data = (char *)value.Length;
  this_local = (BuildNode *)value.Data;
  sVar2 = name.Length;
  local_a28 = name.Data;
  local_5e8 = local_a38;
  local_5f0 = "type";
  local_a38[0] = "type";
  local_a20 = sVar2;
  local_a18 = ctx;
  ctx_local = (ConfigureContext *)this;
  value_local.Length = (size_t)local_a28;
  local_618 = strlen("type");
  local_600 = local_a28;
  local_5f8 = local_a20;
  local_610 = local_a38[0];
  local_620 = local_a38[0];
  local_498 = local_a38[0];
  local_4a0 = &local_600;
  local_1129 = false;
  local_608 = local_618;
  local_490 = local_618;
  if (local_a20 == local_618) {
    local_18 = local_a28;
    local_20 = local_a38[0];
    local_28 = local_618;
    if (local_618 == 0) {
      local_c = 0;
    }
    else {
      local_c = memcmp(local_a28,local_a38[0],local_618);
    }
    local_1129 = local_c == 0;
  }
  if (local_1129) {
    local_a48 = this_local;
    local_a40 = value_local.Data;
    local_5d8 = local_a58;
    local_5e0 = "plain";
    local_a58[0] = "plain";
    local_648 = (char *)strlen("plain");
    local_630 = local_a48;
    local_628 = local_a40;
    local_640 = local_a58[0];
    local_650 = local_a58[0];
    local_480 = local_a58[0];
    local_488 = &local_630;
    bVar3 = false;
    local_638 = local_648;
    local_478 = local_648;
    if (local_a40 == local_648) {
      local_38 = local_a48;
      local_40 = local_a58[0];
      local_48 = local_648;
      if (local_648 == (char *)0x0) {
        local_2c = 0;
      }
      else {
        local_2c = memcmp(local_a48,local_a58[0],(size_t)local_648);
      }
      bVar3 = local_2c == 0;
    }
    if (bVar3) {
      this->type = Plain;
    }
    else {
      local_a68 = this_local;
      local_a60 = value_local.Data;
      local_5c8 = local_a78;
      local_5d0 = "directory";
      local_a78[0] = "directory";
      local_678 = (char *)strlen("directory");
      local_660 = local_a68;
      local_658 = local_a60;
      local_670 = local_a78[0];
      local_680 = local_a78[0];
      local_468 = local_a78[0];
      local_470 = &local_660;
      bVar3 = false;
      local_668 = local_678;
      local_460 = local_678;
      if (local_a60 == local_678) {
        local_58 = local_a68;
        local_60 = local_a78[0];
        local_68 = local_678;
        if (local_678 == (char *)0x0) {
          local_4c = 0;
        }
        else {
          local_4c = memcmp(local_a68,local_a78[0],(size_t)local_678);
        }
        bVar3 = local_4c == 0;
      }
      if (bVar3) {
        this->type = Plain;
      }
      else {
        local_a88 = this_local;
        local_a80 = value_local.Data;
        local_5b8 = local_a98;
        local_5c0 = "directory-structure";
        local_a98[0] = "directory-structure";
        local_6a8 = (char *)strlen("directory-structure");
        local_690 = local_a88;
        local_688 = local_a80;
        local_6a0 = local_a98[0];
        local_6b0 = local_a98[0];
        local_450 = local_a98[0];
        local_458 = &local_690;
        bVar3 = false;
        local_698 = local_6a8;
        local_448 = local_6a8;
        if (local_a80 == local_6a8) {
          local_78 = local_a88;
          local_80 = local_a98[0];
          local_88 = local_6a8;
          if (local_6a8 == (char *)0x0) {
            local_6c = 0;
          }
          else {
            local_6c = memcmp(local_a88,local_a98[0],(size_t)local_6a8);
          }
          bVar3 = local_6c == 0;
        }
        if (bVar3) {
          this->type = DirectoryStructure;
        }
        else {
          local_aa8 = this_local;
          local_aa0 = value_local.Data;
          local_5a8 = local_ab8;
          local_5b0 = "virtual";
          local_ab8[0] = "virtual";
          local_6d8 = (char *)strlen("virtual");
          local_6c0 = local_aa8;
          local_6b8 = local_aa0;
          local_6d0 = local_ab8[0];
          local_6e0 = local_ab8[0];
          local_438 = local_ab8[0];
          local_440 = &local_6c0;
          bVar3 = false;
          local_6c8 = local_6d8;
          local_430 = local_6d8;
          if (local_aa0 == local_6d8) {
            local_98 = local_aa8;
            local_a0 = local_ab8[0];
            local_a8 = local_6d8;
            if (local_6d8 == (char *)0x0) {
              local_8c = 0;
            }
            else {
              local_8c = memcmp(local_aa8,local_ab8[0],(size_t)local_6d8);
            }
            bVar3 = local_8c == 0;
          }
          pCVar1 = local_a18;
          if (!bVar3) {
            llvm::operator+(&local_b18,"invalid value: \'",(StringRef *)&this_local);
            llvm::Twine::Twine(&local_b30,"\' for attribute \'");
            llvm::operator+(&local_b00,&local_b18,&local_b30);
            llvm::Twine::Twine(&local_b48,(StringRef *)&value_local.Length);
            llvm::operator+(&local_ae8,&local_b00,&local_b48);
            llvm::Twine::Twine(&local_b60,"\'");
            llvm::operator+(&local_ad0,&local_ae8,&local_b60);
            ConfigureContext::error(pCVar1,&local_ad0);
            return false;
          }
          this->type = Virtual;
        }
      }
    }
    name_local.Length._7_1_ = true;
  }
  else {
    local_b70 = (void *)value_local.Length;
    local_598 = local_b80;
    local_5a0 = "is-directory";
    local_b80[0] = "is-directory";
    local_b68 = sVar2;
    local_708 = strlen("is-directory");
    local_6f0 = local_b70;
    local_6e8 = local_b68;
    local_700 = local_b80[0];
    local_710 = local_b80[0];
    local_420 = local_b80[0];
    local_428 = &local_6f0;
    bVar3 = false;
    local_6f8 = local_708;
    local_418 = local_708;
    if (local_b68 == local_708) {
      local_b8 = local_b70;
      local_c0 = local_b80[0];
      local_c8 = local_708;
      if (local_708 == 0) {
        local_ac = 0;
      }
      else {
        local_ac = memcmp(local_b70,local_b80[0],local_708);
      }
      bVar3 = local_ac == 0;
    }
    if (bVar3) {
      local_b90 = this_local;
      local_b88 = value_local.Data;
      local_588 = local_ba0;
      local_590 = "true";
      local_ba0[0] = "true";
      local_738 = (char *)strlen("true");
      local_720 = local_b90;
      local_718 = local_b88;
      local_730 = local_ba0[0];
      local_740 = local_ba0[0];
      local_408 = local_ba0[0];
      local_410 = &local_720;
      bVar3 = false;
      local_728 = local_738;
      local_400 = local_738;
      if (local_b88 == local_738) {
        local_d8 = local_b90;
        local_e0 = local_ba0[0];
        local_e8 = local_738;
        if (local_738 == (char *)0x0) {
          local_cc = 0;
        }
        else {
          local_cc = memcmp(local_b90,local_ba0[0],(size_t)local_738);
        }
        bVar3 = local_cc == 0;
      }
      if (bVar3) {
        this->type = Directory;
      }
      else {
        local_bb0 = this_local;
        local_ba8 = value_local.Data;
        local_578 = local_bc0;
        local_580 = "false";
        local_bc0[0] = "false";
        local_768 = (char *)strlen("false");
        local_750 = local_bb0;
        local_748 = local_ba8;
        local_760 = local_bc0[0];
        local_770 = local_bc0[0];
        local_3f0 = local_bc0[0];
        local_3f8 = &local_750;
        bVar3 = false;
        local_758 = local_768;
        local_3e8 = local_768;
        if (local_ba8 == local_768) {
          local_f8 = local_bb0;
          local_100 = local_bc0[0];
          local_108 = local_768;
          if (local_768 == (char *)0x0) {
            local_ec = 0;
          }
          else {
            local_ec = memcmp(local_bb0,local_bc0[0],(size_t)local_768);
          }
          bVar3 = local_ec == 0;
        }
        pCVar1 = local_a18;
        if (!bVar3) {
          llvm::operator+(&local_c20,"invalid value: \'",(StringRef *)&this_local);
          llvm::Twine::Twine(&local_c38,"\' for attribute \'");
          llvm::operator+(&local_c08,&local_c20,&local_c38);
          llvm::Twine::Twine(&local_c50,(StringRef *)&value_local.Length);
          llvm::operator+(&local_bf0,&local_c08,&local_c50);
          llvm::Twine::Twine(&local_c68,"\'");
          llvm::operator+(&local_bd8,&local_bf0,&local_c68);
          ConfigureContext::error(pCVar1,&local_bd8);
          return false;
        }
        if (this->type == Directory) {
          this->type = Plain;
        }
      }
      name_local.Length._7_1_ = true;
    }
    else {
      local_c78 = (void *)value_local.Length;
      local_568 = local_c88;
      local_570 = "is-directory-structure";
      local_c88[0] = "is-directory-structure";
      local_c70 = sVar2;
      local_798 = strlen("is-directory-structure");
      local_780 = local_c78;
      local_778 = local_c70;
      local_790 = local_c88[0];
      local_7a0 = local_c88[0];
      local_3d8 = local_c88[0];
      local_3e0 = &local_780;
      bVar3 = false;
      local_788 = local_798;
      local_3d0 = local_798;
      if (local_c70 == local_798) {
        local_118 = local_c78;
        local_120 = local_c88[0];
        local_128 = local_798;
        if (local_798 == 0) {
          local_10c = 0;
        }
        else {
          local_10c = memcmp(local_c78,local_c88[0],local_798);
        }
        bVar3 = local_10c == 0;
      }
      if (bVar3) {
        local_c98 = this_local;
        local_c90 = value_local.Data;
        local_558 = local_ca8;
        local_560 = "true";
        local_ca8[0] = "true";
        local_7c8 = (char *)strlen("true");
        local_7b0 = local_c98;
        local_7a8 = local_c90;
        local_7c0 = local_ca8[0];
        local_7d0 = local_ca8[0];
        local_3c0 = local_ca8[0];
        local_3c8 = &local_7b0;
        bVar3 = false;
        local_7b8 = local_7c8;
        local_3b8 = local_7c8;
        if (local_c90 == local_7c8) {
          local_138 = local_c98;
          local_140 = local_ca8[0];
          local_148 = local_7c8;
          if (local_7c8 == (char *)0x0) {
            local_12c = 0;
          }
          else {
            local_12c = memcmp(local_c98,local_ca8[0],(size_t)local_7c8);
          }
          bVar3 = local_12c == 0;
        }
        if (bVar3) {
          this->type = DirectoryStructure;
        }
        else {
          local_cb8 = this_local;
          local_cb0 = value_local.Data;
          local_548 = local_cc8;
          local_550 = "false";
          local_cc8[0] = "false";
          local_7f8 = (char *)strlen("false");
          local_7e0 = local_cb8;
          local_7d8 = local_cb0;
          local_7f0 = local_cc8[0];
          local_800 = local_cc8[0];
          local_3a8 = local_cc8[0];
          local_3b0 = &local_7e0;
          bVar3 = false;
          local_7e8 = local_7f8;
          local_3a0 = local_7f8;
          if (local_cb0 == local_7f8) {
            local_158 = local_cb8;
            local_160 = local_cc8[0];
            local_168 = local_7f8;
            if (local_7f8 == (char *)0x0) {
              local_14c = 0;
            }
            else {
              local_14c = memcmp(local_cb8,local_cc8[0],(size_t)local_7f8);
            }
            bVar3 = local_14c == 0;
          }
          pCVar1 = local_a18;
          if (!bVar3) {
            llvm::operator+(&local_d28,"invalid value: \'",(StringRef *)&this_local);
            llvm::Twine::Twine(&local_d40,"\' for attribute \'");
            llvm::operator+(&local_d10,&local_d28,&local_d40);
            llvm::Twine::Twine(&local_d58,(StringRef *)&value_local.Length);
            llvm::operator+(&local_cf8,&local_d10,&local_d58);
            llvm::Twine::Twine(&local_d70,"\'");
            llvm::operator+(&local_ce0,&local_cf8,&local_d70);
            ConfigureContext::error(pCVar1,&local_ce0);
            return false;
          }
          if (this->type == DirectoryStructure) {
            this->type = Plain;
          }
        }
        name_local.Length._7_1_ = true;
      }
      else {
        local_d80 = (void *)value_local.Length;
        local_538 = local_d90;
        local_540 = "is-virtual";
        local_d90[0] = "is-virtual";
        local_d78 = sVar2;
        local_828 = strlen("is-virtual");
        local_810 = local_d80;
        local_808 = local_d78;
        local_820 = local_d90[0];
        local_830 = local_d90[0];
        local_390 = local_d90[0];
        local_398 = &local_810;
        bVar3 = false;
        local_818 = local_828;
        local_388 = local_828;
        if (local_d78 == local_828) {
          local_178 = local_d80;
          local_180 = local_d90[0];
          local_188 = local_828;
          if (local_828 == 0) {
            local_16c = 0;
          }
          else {
            local_16c = memcmp(local_d80,local_d90[0],local_828);
          }
          bVar3 = local_16c == 0;
        }
        if (bVar3) {
          local_da0 = this_local;
          local_d98 = value_local.Data;
          local_528 = local_db0;
          local_530 = "true";
          local_db0[0] = "true";
          local_858 = (char *)strlen("true");
          local_840 = local_da0;
          local_838 = local_d98;
          local_850 = local_db0[0];
          local_860 = local_db0[0];
          local_378 = local_db0[0];
          local_380 = &local_840;
          bVar3 = false;
          local_848 = local_858;
          local_370 = local_858;
          if (local_d98 == local_858) {
            local_198 = local_da0;
            local_1a0 = local_db0[0];
            local_1a8 = local_858;
            if (local_858 == (char *)0x0) {
              local_18c = 0;
            }
            else {
              local_18c = memcmp(local_da0,local_db0[0],(size_t)local_858);
            }
            bVar3 = local_18c == 0;
          }
          if (bVar3) {
            this->type = Virtual;
          }
          else {
            local_dc0 = this_local;
            local_db8 = value_local.Data;
            local_518 = local_dd0;
            local_520 = "false";
            local_dd0[0] = "false";
            local_888 = (char *)strlen("false");
            local_870 = local_dc0;
            local_868 = local_db8;
            local_880 = local_dd0[0];
            local_890 = local_dd0[0];
            local_360 = local_dd0[0];
            local_368 = &local_870;
            bVar3 = false;
            local_878 = local_888;
            local_358 = local_888;
            if (local_db8 == local_888) {
              local_1b8 = local_dc0;
              local_1c0 = local_dd0[0];
              local_1c8 = local_888;
              if (local_888 == (char *)0x0) {
                local_1ac = 0;
              }
              else {
                local_1ac = memcmp(local_dc0,local_dd0[0],(size_t)local_888);
              }
              bVar3 = local_1ac == 0;
            }
            pCVar1 = local_a18;
            if (!bVar3) {
              llvm::operator+(&local_e30,"invalid value: \'",(StringRef *)&this_local);
              llvm::Twine::Twine(&local_e48,"\' for attribute \'");
              llvm::operator+(&local_e18,&local_e30,&local_e48);
              llvm::Twine::Twine(&local_e60,(StringRef *)&value_local.Length);
              llvm::operator+(&local_e00,&local_e18,&local_e60);
              llvm::Twine::Twine(&local_e78,"\'");
              llvm::operator+(&local_de8,&local_e00,&local_e78);
              ConfigureContext::error(pCVar1,&local_de8);
              return false;
            }
            if (this->type == Virtual) {
              this->type = Plain;
            }
            this->commandTimestamp = false;
          }
          name_local.Length._7_1_ = true;
        }
        else {
          local_e88 = (void *)value_local.Length;
          local_508 = local_e98;
          local_510 = "is-command-timestamp";
          local_e98[0] = "is-command-timestamp";
          local_e80 = sVar2;
          local_8b8 = strlen("is-command-timestamp");
          local_8a0 = local_e88;
          local_898 = local_e80;
          local_8b0 = local_e98[0];
          local_8c0 = local_e98[0];
          local_348 = local_e98[0];
          local_350 = &local_8a0;
          bVar3 = false;
          local_8a8 = local_8b8;
          local_340 = local_8b8;
          if (local_e80 == local_8b8) {
            local_1d8 = local_e88;
            local_1e0 = local_e98[0];
            local_1e8 = local_8b8;
            if (local_8b8 == 0) {
              local_1cc = 0;
            }
            else {
              local_1cc = memcmp(local_e88,local_e98[0],local_8b8);
            }
            bVar3 = local_1cc == 0;
          }
          if (bVar3) {
            local_ea8 = this_local;
            local_ea0 = value_local.Data;
            local_4f8 = local_eb8;
            local_500 = "true";
            local_eb8[0] = "true";
            local_8e8 = (char *)strlen("true");
            local_8d0 = local_ea8;
            local_8c8 = local_ea0;
            local_8e0 = local_eb8[0];
            local_8f0 = local_eb8[0];
            local_330 = local_eb8[0];
            local_338 = &local_8d0;
            bVar3 = false;
            local_8d8 = local_8e8;
            local_328 = local_8e8;
            if (local_ea0 == local_8e8) {
              local_1f8 = local_ea8;
              local_200 = local_eb8[0];
              local_208 = local_8e8;
              if (local_8e8 == (char *)0x0) {
                local_1ec = 0;
              }
              else {
                local_1ec = memcmp(local_ea8,local_eb8[0],(size_t)local_8e8);
              }
              bVar3 = local_1ec == 0;
            }
            if (bVar3) {
              this->commandTimestamp = true;
              this->type = Virtual;
            }
            else {
              local_ec8 = this_local;
              local_ec0 = value_local.Data;
              local_4e8 = local_ed8;
              local_4f0 = "false";
              local_ed8[0] = "false";
              local_918 = (char *)strlen("false");
              local_900 = local_ec8;
              local_8f8 = local_ec0;
              local_910 = local_ed8[0];
              local_920 = local_ed8[0];
              local_318 = local_ed8[0];
              local_320 = &local_900;
              bVar3 = false;
              local_908 = local_918;
              local_310 = local_918;
              if (local_ec0 == local_918) {
                local_218 = local_ec8;
                local_220 = local_ed8[0];
                local_228 = local_918;
                if (local_918 == (char *)0x0) {
                  local_20c = 0;
                }
                else {
                  local_20c = memcmp(local_ec8,local_ed8[0],(size_t)local_918);
                }
                bVar3 = local_20c == 0;
              }
              pCVar1 = local_a18;
              if (!bVar3) {
                llvm::operator+(&local_f38,"invalid value: \'",(StringRef *)&this_local);
                llvm::Twine::Twine(&local_f50,"\' for attribute \'");
                llvm::operator+(&local_f20,&local_f38,&local_f50);
                llvm::Twine::Twine(&local_f68,(StringRef *)&value_local.Length);
                llvm::operator+(&local_f08,&local_f20,&local_f68);
                llvm::Twine::Twine(&local_f80,"\'");
                llvm::operator+(&local_ef0,&local_f08,&local_f80);
                ConfigureContext::error(pCVar1,&local_ef0);
                return false;
              }
              this->commandTimestamp = false;
            }
            name_local.Length._7_1_ = true;
          }
          else {
            local_f90 = (void *)value_local.Length;
            local_4d8 = local_fa0;
            local_4e0 = "is-mutated";
            local_fa0[0] = "is-mutated";
            local_f88 = sVar2;
            local_948 = strlen("is-mutated");
            local_930 = local_f90;
            local_928 = local_f88;
            local_940 = local_fa0[0];
            local_950 = local_fa0[0];
            local_300 = local_fa0[0];
            local_308 = &local_930;
            bVar3 = false;
            local_938 = local_948;
            local_2f8 = local_948;
            if (local_f88 == local_948) {
              local_238 = local_f90;
              local_240 = local_fa0[0];
              local_248 = local_948;
              if (local_948 == 0) {
                local_22c = 0;
              }
              else {
                local_22c = memcmp(local_f90,local_fa0[0],local_948);
              }
              bVar3 = local_22c == 0;
            }
            if (bVar3) {
              local_fb0 = this_local;
              local_fa8 = value_local.Data;
              local_4c8 = local_fc0;
              local_4d0 = "true";
              local_fc0[0] = "true";
              local_978 = (char *)strlen("true");
              local_960 = local_fb0;
              local_958 = local_fa8;
              local_970 = local_fc0[0];
              local_980 = local_fc0[0];
              local_2e8 = local_fc0[0];
              local_2f0 = &local_960;
              bVar3 = false;
              local_968 = local_978;
              local_2e0 = local_978;
              if (local_fa8 == local_978) {
                local_258 = local_fb0;
                local_260 = local_fc0[0];
                local_268 = local_978;
                if (local_978 == (char *)0x0) {
                  local_24c = 0;
                }
                else {
                  local_24c = memcmp(local_fb0,local_fc0[0],(size_t)local_978);
                }
                bVar3 = local_24c == 0;
              }
              if (bVar3) {
                this->mutated = true;
              }
              else {
                local_fd0 = this_local;
                local_fc8 = value_local.Data;
                local_4b8 = local_fe0;
                local_4c0 = "false";
                local_fe0[0] = "false";
                local_9a8 = (char *)strlen("false");
                local_990 = local_fd0;
                local_988 = local_fc8;
                local_9a0 = local_fe0[0];
                local_9b0 = local_fe0[0];
                local_2d0 = local_fe0[0];
                local_2d8 = &local_990;
                bVar3 = false;
                local_998 = local_9a8;
                local_2c8 = local_9a8;
                if (local_fc8 == local_9a8) {
                  local_278 = local_fd0;
                  local_280 = local_fe0[0];
                  local_288 = local_9a8;
                  if (local_9a8 == (char *)0x0) {
                    local_26c = 0;
                  }
                  else {
                    local_26c = memcmp(local_fd0,local_fe0[0],(size_t)local_9a8);
                  }
                  bVar3 = local_26c == 0;
                }
                pCVar1 = local_a18;
                if (!bVar3) {
                  llvm::operator+(&local_1040,"invalid value: \'",(StringRef *)&this_local);
                  llvm::Twine::Twine(&local_1058,"\' for attribute \'");
                  llvm::operator+(&local_1028,&local_1040,&local_1058);
                  llvm::Twine::Twine(&local_1070,(StringRef *)&value_local.Length);
                  llvm::operator+(&local_1010,&local_1028,&local_1070);
                  llvm::Twine::Twine(&local_1088,"\'");
                  llvm::operator+(&local_ff8,&local_1010,&local_1088);
                  ConfigureContext::error(pCVar1,&local_ff8);
                  return false;
                }
                this->mutated = false;
              }
              name_local.Length._7_1_ = true;
            }
            else {
              local_1098 = (void *)value_local.Length;
              local_4a8 = local_10a8;
              local_4b0 = "content-exclusion-patterns";
              local_10a8[0] = "content-exclusion-patterns";
              local_1090 = sVar2;
              local_2b0 = strlen("content-exclusion-patterns");
              local_9c0 = local_1098;
              local_9b8 = local_1090;
              local_2b8 = local_10a8[0];
              local_2c0 = &local_9c0;
              bVar3 = false;
              if (local_1090 == local_2b0) {
                local_298 = local_1098;
                local_2a0 = local_10a8[0];
                local_2a8 = local_2b0;
                if (local_2b0 == 0) {
                  local_28c = 0;
                }
                else {
                  local_28c = memcmp(local_1098,local_10a8[0],local_2b0);
                }
                bVar3 = local_28c == 0;
              }
              pCVar1 = local_a18;
              if (bVar3) {
                local_10c8 = this_local;
                local_10c0 = value_local.Data;
                value_00.Length = (size_t)value_local.Data;
                value_00.Data = (char *)this_local;
                llbuild::basic::StringList::StringList(&local_10b8,value_00);
                llbuild::basic::StringList::operator=(&this->exclusionPatterns,&local_10b8);
                llbuild::basic::StringList::~StringList(&local_10b8);
                name_local.Length._7_1_ = true;
              }
              else {
                llvm::operator+(&local_10f8,"unexpected attribute: \'",
                                (StringRef *)&value_local.Length);
                llvm::Twine::Twine(&local_1110,"\'");
                llvm::operator+(&local_10e0,&local_10f8,&local_1110);
                ConfigureContext::error(pCVar1,&local_10e0);
                name_local.Length._7_1_ = false;
              }
            }
          }
        }
      }
    }
  }
  return name_local.Length._7_1_;
}

Assistant:

bool BuildNode::configureAttribute(const ConfigureContext& ctx, StringRef name,
                                   StringRef value) {
  if (name == "type") {
    if (value == "plain") {
      type = NodeType::Plain;
    } else if (value == "directory") {
      type = NodeType::Plain;
    } else if (value == "directory-structure") {
      type = NodeType::DirectoryStructure;
    } else if (value == "virtual") {
      type = NodeType::Virtual;
    } else {
      ctx.error("invalid value: '" + value + "' for attribute '"
                + name + "'");
      return false;
    }
    return true;
  } else if (name == "is-directory") { // Note: Deprecated in favor of 'type'.
    if (value == "true") {
      type = NodeType::Directory;
    } else if (value == "false") {
      if (type == NodeType::Directory)
        type = NodeType::Plain;
    } else {
      ctx.error("invalid value: '" + value + "' for attribute '"
                + name + "'");
      return false;
    }
    return true;
  } else if (name == "is-directory-structure") { // Note: Deprecated in favor of 'type'.
    if (value == "true") {
      type = NodeType::DirectoryStructure;
    } else if (value == "false") {
      if (type == NodeType::DirectoryStructure)
        type = NodeType::Plain;
    } else {
      ctx.error("invalid value: '" + value + "' for attribute '"
                + name + "'");
      return false;
    }
    return true;
  } else if (name == "is-virtual") { // Note: Deprecated in favor of 'type'.
    if (value == "true") {
      type = NodeType::Virtual;
    } else if (value == "false") {
      if (type == NodeType::Virtual)
        type = NodeType::Plain;
      commandTimestamp = false;
    } else {
      ctx.error("invalid value: '" + value + "' for attribute '"
                + name + "'");
      return false;
    }
    return true;
  } else if (name == "is-command-timestamp") {
    if (value == "true") {
      commandTimestamp = true;
      type = NodeType::Virtual;
    } else if (value == "false") {
      commandTimestamp = false;
    } else {
      ctx.error("invalid value: '" + value + "' for attribute '"
                + name + "'");
      return false;
    }
    return true;
  } else if (name == "is-mutated") {
    if (value == "true") {
      mutated = true;
    } else if (value == "false") {
      mutated = false;
    } else {
      ctx.error("invalid value: '" + value + "' for attribute '"
                + name + "'");
      return false;
    }
    return true;
  } else if (name == "content-exclusion-patterns") {
    exclusionPatterns = basic::StringList(value);
    return true;
  }
    
  // We don't support any other custom attributes.
  ctx.error("unexpected attribute: '" + name + "'");
  return false;
}